

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_vector.h
# Opt level: O0

gc_heap_ptr<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table> __thiscall
mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table::make<>
          (gc_table *this,gc_heap *h,uint32_t capacity)

{
  gc_heap_ptr<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table> gVar1;
  uint32_t capacity_local;
  gc_heap *h_local;
  
  if (capacity != 0) {
    gVar1 = gc_heap::
            allocate_and_construct<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table,mjs::gc_heap&,unsigned_int&>
                      ((gc_heap *)this,(size_t)h,(gc_heap *)((ulong)capacity * 8 + 0x10),(uint *)h);
    gVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
    return (gc_heap_ptr<mjs::gc_vector<mjs::(anonymous_namespace)::string_cache::entry>::gc_table>)
           gVar1.super_gc_heap_ptr_untyped;
  }
  __assert_fail("capacity",
                "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/gc_vector.h",
                0x65,
                "static gc_heap_ptr<gc_table> mjs::gc_vector<mjs::(anonymous namespace)::string_cache::entry>::gc_table::make(gc_heap &, uint32_t, Args &&...) [T = mjs::(anonymous namespace)::string_cache::entry, Args = <>]"
               );
}

Assistant:

static gc_heap_ptr<gc_table> make(gc_heap& h, uint32_t capacity, Args&&... args) {
            assert(capacity);
            return h.allocate_and_construct<gc_table>(sizeof(gc_table) + capacity * sizeof(T), h, capacity, std::forward<Args>(args)...);
        }